

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_affine_avx2.c
# Opt level: O1

void av1_highbd_warp_affine_avx2
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined2 uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined2 uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined4 uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  short sVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  undefined1 (*pauVar42) [32];
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  long lVar56;
  int iVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  ushort uVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  __m256i round_const;
  int32_t tmp1 [8];
  __m256i tmp [15];
  int local_4a4;
  int local_488;
  undefined1 local_3a0 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [224];
  undefined1 local_160 [304];
  
  uVar3 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar51 = 0xe - uVar3;
  }
  else {
    uVar51 = conv_params->round_1;
  }
  uVar29 = 0xff;
  if (bd == 0xc) {
    uVar29 = 0xfff;
  }
  uVar21 = 0x3ff;
  if (bd != 10) {
    uVar21 = uVar29;
  }
  bVar9 = (byte)bd;
  uVar34 = 1 << (bVar9 + 6 & 0x1f);
  if (0 < p_height) {
    iVar38 = conv_params->round_1 + uVar3;
    uVar55 = 0xe - iVar38;
    iVar1 = conv_params->fwd_offset;
    iVar2 = conv_params->bck_offset;
    bVar10 = (byte)uVar3;
    bVar11 = (bVar9 + 0xe) - (char)iVar38;
    iVar39 = (-1 << (bVar11 & 0x1f)) + (-1 << (bVar11 - 1 & 0x1f)) +
             ((1 << ((byte)uVar55 & 0x1f)) >> 1);
    iVar43 = (1 << ((byte)uVar51 & 0x1f)) >> 1;
    iVar47 = (1 << (bVar10 - 1 & 0x1f)) + uVar34;
    iVar38 = (1 << ((bVar9 + 0xe) - bVar10 & 0x1f)) + iVar43;
    iVar57 = (int)alpha;
    iVar48 = 1 << ((bVar10 ^ 0xff) + bVar9 + 7 & 0x1f);
    iVar43 = (-1 << (((byte)uVar51 + bVar9) - 1 & 0x1f)) + iVar43;
    iVar44 = (int)beta;
    uVar12 = (ushort)(-1 << (bVar9 & 0x1f));
    uVar84 = uVar12 ^ 0xffff;
    iVar30 = (int)gamma;
    iVar35 = iVar44 * -3 + 0x10200;
    auVar65._4_4_ = iVar38;
    auVar65._0_4_ = iVar38;
    auVar65._8_4_ = iVar38;
    auVar65._12_4_ = iVar38;
    auVar65._16_4_ = iVar38;
    auVar65._20_4_ = iVar38;
    auVar65._24_4_ = iVar38;
    auVar65._28_4_ = iVar38;
    iVar49 = height + -1;
    lVar26 = (long)height;
    iVar36 = width + -1;
    auVar91._4_4_ = iVar36;
    auVar91._0_4_ = iVar36;
    auVar91._8_4_ = iVar36;
    auVar91._12_4_ = iVar36;
    auVar91._16_4_ = iVar36;
    auVar91._20_4_ = iVar36;
    auVar91._24_4_ = iVar36;
    auVar91._28_4_ = iVar36;
    auVar4 = vpmovsxbd_avx(ZEXT416(0x3020104));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0xf8f9fafb));
    local_4a4 = 0;
    iVar38 = 0;
    auVar6 = vpmovsxbq_avx2(ZEXT416(0xfcfdfeff));
    do {
      if (0 < p_width) {
        lVar27 = (long)(p_row + 4 + iVar38 << ((byte)subsampling_y & 0x1f));
        iVar31 = p_height - iVar38;
        iVar22 = 8;
        if (iVar31 < 8) {
          iVar22 = iVar31;
        }
        lVar56 = (long)iVar22;
        iVar25 = 0;
        local_488 = local_4a4;
        do {
          lVar28 = (long)(iVar25 + p_col + 4 << ((byte)subsampling_x & 0x1f));
          lVar40 = (long)mat[1] + mat[5] * lVar27 + mat[4] * lVar28 >> ((byte)subsampling_y & 0x3f);
          uVar53 = (uint)((long)*mat + mat[3] * lVar27 + mat[2] * lVar28 >>
                         ((byte)subsampling_x & 0x3f));
          iVar32 = (int)uVar53 >> 0x10;
          sVar37 = (short)((ulong)lVar40 >> 0x10);
          if (iVar32 < -6) {
            if (-7 < iVar31) {
              lVar28 = (long)sVar37 + -7;
              lVar41 = -7;
              pauVar42 = (undefined1 (*) [32])local_240;
              do {
                iVar32 = iVar49;
                if (lVar28 < lVar26) {
                  iVar32 = (int)lVar28;
                }
                if (lVar28 < 0) {
                  iVar32 = 0;
                }
                auVar58._0_2_ =
                     (undefined2)(((uint)ref[iVar32 * stride] << (7 - bVar10 & 0x1f)) + iVar48);
                auVar58._2_2_ = auVar58._0_2_;
                auVar58._4_2_ = auVar58._0_2_;
                auVar58._6_2_ = auVar58._0_2_;
                auVar58._8_2_ = auVar58._0_2_;
                auVar58._10_2_ = auVar58._0_2_;
                auVar58._12_2_ = auVar58._0_2_;
                auVar58._14_2_ = auVar58._0_2_;
                auVar62 = vpmovsxwd_avx2(auVar58);
                *pauVar42 = auVar62;
                lVar41 = lVar41 + 1;
                pauVar42 = pauVar42 + 1;
                lVar28 = lVar28 + 1;
              } while (lVar41 < lVar56);
            }
          }
          else if (iVar32 < width + 6) {
            uVar53 = (uVar53 & 0xfffc) + (iVar44 + iVar57) * -4 & 0xffffffc0;
            iVar54 = uVar53 + 0x10200;
            if (width < iVar32 + 9 || iVar32 < 7) {
              if (-7 < iVar31) {
                lVar28 = -7;
                do {
                  iVar23 = (int)(sVar37 + lVar28);
                  iVar45 = iVar49;
                  if (iVar23 < iVar49) {
                    iVar45 = iVar23;
                  }
                  if (sVar37 + lVar28 < 0) {
                    iVar45 = 0;
                  }
                  iVar45 = iVar45 * stride;
                  iVar23 = ((int)lVar28 + 4) * iVar44 + iVar54;
                  auVar66._4_4_ = iVar45;
                  auVar66._0_4_ = iVar45;
                  auVar66._8_4_ = iVar45;
                  auVar66._12_4_ = iVar45;
                  auVar66._16_4_ = iVar45;
                  auVar66._20_4_ = iVar45;
                  auVar66._24_4_ = iVar45;
                  auVar66._28_4_ = iVar45;
                  uVar53 = 0;
                  uVar52 = 0;
                  do {
                    lVar41 = uVar52 + (long)iVar32 + -7;
                    uVar33 = (undefined4)lVar41;
                    iVar45 = (int)uVar52;
                    iVar24 = iVar32 + -2 + iVar45;
                    iVar46 = iVar32 + -1 + iVar45;
                    iVar45 = iVar32 + iVar45;
                    auVar59._4_4_ = uVar33;
                    auVar59._0_4_ = uVar33;
                    auVar59._8_4_ = uVar33;
                    auVar59._12_4_ = uVar33;
                    auVar60 = vpaddd_avx(auVar4,auVar59);
                    auVar62 = vpermq_avx2(ZEXT1632(auVar60),0xc4);
                    auVar62 = vpblendd_avx2(auVar62,ZEXT1632(auVar59),1);
                    auVar72._4_4_ = iVar24;
                    auVar72._0_4_ = iVar24;
                    auVar72._8_4_ = iVar24;
                    auVar72._12_4_ = iVar24;
                    auVar72._16_4_ = iVar24;
                    auVar72._20_4_ = iVar24;
                    auVar72._24_4_ = iVar24;
                    auVar72._28_4_ = iVar24;
                    auVar62 = vpblendd_avx2(auVar62,auVar72,0x20);
                    auVar73._4_4_ = iVar46;
                    auVar73._0_4_ = iVar46;
                    auVar73._8_4_ = iVar46;
                    auVar73._12_4_ = iVar46;
                    auVar73._16_4_ = iVar46;
                    auVar73._20_4_ = iVar46;
                    auVar73._24_4_ = iVar46;
                    auVar73._28_4_ = iVar46;
                    auVar62 = vpblendd_avx2(auVar62,auVar73,0x40);
                    auVar74._4_4_ = iVar45;
                    auVar74._0_4_ = iVar45;
                    auVar74._8_4_ = iVar45;
                    auVar74._12_4_ = iVar45;
                    auVar74._16_4_ = iVar45;
                    auVar74._20_4_ = iVar45;
                    auVar74._24_4_ = iVar45;
                    auVar74._28_4_ = iVar45;
                    auVar69 = vpblendd_avx2(auVar62,auVar74,0x80);
                    auVar75._8_8_ = lVar41;
                    auVar75._0_8_ = lVar41;
                    auVar75._16_8_ = lVar41;
                    auVar75._24_8_ = lVar41;
                    auVar62 = vpcmpgtq_avx2(auVar75,auVar5);
                    auVar81 = vpminsd_avx2(auVar69,auVar91);
                    auVar69 = vpcmpgtq_avx2(auVar75,auVar6);
                    auVar62 = vpackssdw_avx2(auVar69,auVar62);
                    auVar62 = vpermq_avx2(auVar62,0xd8);
                    auVar62 = vblendvps_avx(ZEXT1632(ZEXT816(0) << 0x40),auVar81,auVar62);
                    auVar69 = vpmovsxwd_avx2((undefined1  [16])av1_warped_filter[iVar23 >> 10]);
                    auVar62 = vpaddd_avx2(auVar62,auVar66);
                    auVar60 = vpinsrw_avx(ZEXT216(ref[auVar62._0_4_]),(uint)ref[auVar62._4_4_],1);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._8_4_],2);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._12_4_],3);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._16_4_],4);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._20_4_],5);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._24_4_],6);
                    auVar60 = vpinsrw_avx(auVar60,(uint)ref[auVar62._28_4_],7);
                    auVar62 = vpmovzxwd_avx2(auVar60);
                    auVar62 = vpmulld_avx2(auVar69,auVar62);
                    auVar60 = vphaddd_avx(auVar62._0_16_,auVar62._16_16_);
                    auVar62 = vpaddd_avx2(ZEXT1632(auVar60),ZEXT432(uVar34));
                    auVar60 = vphaddd_avx(auVar62._16_16_,auVar62._0_16_);
                    auVar60 = vphaddd_avx(auVar60,auVar60);
                    auVar60 = vphaddd_avx(auVar60,auVar60);
                    *(int *)(local_260 +
                            (ulong)((uVar53 & 4) + ((uint)(uVar52 >> 1) & 0x7fffffff)) * 4) =
                         auVar60._0_4_ + ((1 << (bVar10 & 0x1f)) >> 1) >> (bVar10 & 0x1f);
                    iVar23 = iVar23 + iVar57;
                    uVar52 = uVar52 + 1;
                    uVar53 = uVar53 + 4;
                  } while (uVar52 != 8);
                  *(undefined1 (*) [32])(local_160 + lVar28 * 0x20) = local_260;
                  lVar28 = lVar28 + 1;
                } while (lVar28 < lVar56);
              }
            }
            else {
              auVar60 = ZEXT416(uVar3);
              iVar45 = iVar54 >> 10;
              if (beta == 0 && alpha == 0) {
                if (-7 < iVar31) {
                  local_3a0._4_4_ = *(undefined4 *)av1_warped_filter[iVar45];
                  local_3a0._0_4_ = local_3a0._4_4_;
                  local_3a0._8_4_ = local_3a0._4_4_;
                  local_3a0._12_4_ = local_3a0._4_4_;
                  local_3a0._16_4_ = local_3a0._4_4_;
                  local_3a0._20_4_ = local_3a0._4_4_;
                  local_3a0._24_4_ = local_3a0._4_4_;
                  local_3a0._28_4_ = local_3a0._4_4_;
                  uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 2);
                  auVar69._4_4_ = uVar33;
                  auVar69._0_4_ = uVar33;
                  auVar69._8_4_ = uVar33;
                  auVar69._12_4_ = uVar33;
                  auVar69._16_4_ = uVar33;
                  auVar69._20_4_ = uVar33;
                  auVar69._24_4_ = uVar33;
                  auVar69._28_4_ = uVar33;
                  uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 4);
                  auVar62._4_4_ = uVar33;
                  auVar62._0_4_ = uVar33;
                  auVar62._8_4_ = uVar33;
                  auVar62._12_4_ = uVar33;
                  auVar62._16_4_ = uVar33;
                  auVar62._20_4_ = uVar33;
                  auVar62._24_4_ = uVar33;
                  auVar62._28_4_ = uVar33;
                  uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 6);
                  auVar81._4_4_ = uVar33;
                  auVar81._0_4_ = uVar33;
                  auVar81._8_4_ = uVar33;
                  auVar81._12_4_ = uVar33;
                  auVar81._16_4_ = uVar33;
                  auVar81._20_4_ = uVar33;
                  auVar81._24_4_ = uVar33;
                  auVar81._28_4_ = uVar33;
                  lVar28 = (long)sVar37 + -7;
                  lVar41 = -7;
                  pauVar42 = (undefined1 (*) [32])local_240;
                  do {
                    iVar54 = iVar49;
                    if (lVar28 < lVar26) {
                      iVar54 = (int)lVar28;
                    }
                    if (lVar28 < 0) {
                      iVar54 = 0;
                    }
                    lVar50 = (long)(iVar54 * stride + iVar32);
                    auVar90._16_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    auVar90._0_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    auVar70 = vpalignr_avx2(auVar90,*(undefined1 (*) [32])(ref + lVar50 + -7),2);
                    auVar82 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar50 + -7),auVar70,0x20
                                             );
                    auVar78 = vpblendd_avx2(auVar90,auVar70,0xf0);
                    auVar90 = vpmaddwd_avx2(auVar82,local_3a0);
                    auVar70 = vpalignr_avx2(auVar78,auVar82,4);
                    auVar7 = vpmaddwd_avx2(auVar70,auVar69);
                    auVar70 = vpalignr_avx2(auVar78,auVar82,8);
                    auVar8 = vpmaddwd_avx2(auVar62,auVar70);
                    auVar70 = vpalignr_avx2(auVar78,auVar82,0xc);
                    auVar70 = vpmaddwd_avx2(auVar70,auVar81);
                    auVar70 = vpaddd_avx2(auVar70,auVar8);
                    auVar8._4_4_ = iVar47;
                    auVar8._0_4_ = iVar47;
                    auVar8._8_4_ = iVar47;
                    auVar8._12_4_ = iVar47;
                    auVar8._16_4_ = iVar47;
                    auVar8._20_4_ = iVar47;
                    auVar8._24_4_ = iVar47;
                    auVar8._28_4_ = iVar47;
                    auVar90 = vpaddd_avx2(auVar90,auVar8);
                    auVar90 = vpaddd_avx2(auVar90,auVar7);
                    auVar70 = vpaddd_avx2(auVar90,auVar70);
                    auVar70 = vpsrad_avx2(auVar70,auVar60);
                    *pauVar42 = auVar70;
                    lVar41 = lVar41 + 1;
                    pauVar42 = pauVar42 + 1;
                    lVar28 = lVar28 + 1;
                  } while (lVar41 < lVar56);
                }
              }
              else if (alpha == 0) {
                if (-7 < iVar31) {
                  iVar54 = uVar53 + iVar35;
                  lVar28 = (long)sVar37 + -7;
                  lVar41 = -7;
                  pauVar42 = (undefined1 (*) [32])local_240;
                  do {
                    iVar45 = iVar49;
                    if (lVar28 < lVar26) {
                      iVar45 = (int)lVar28;
                    }
                    if (lVar28 < 0) {
                      iVar45 = 0;
                    }
                    lVar50 = (long)(iVar45 * stride + iVar32);
                    auVar70._16_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    auVar70._0_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    iVar45 = iVar54 >> 10;
                    uVar33 = *(undefined4 *)av1_warped_filter[iVar45];
                    auVar78._4_4_ = uVar33;
                    auVar78._0_4_ = uVar33;
                    auVar78._8_4_ = uVar33;
                    auVar78._12_4_ = uVar33;
                    auVar78._16_4_ = uVar33;
                    auVar78._20_4_ = uVar33;
                    auVar78._24_4_ = uVar33;
                    auVar78._28_4_ = uVar33;
                    uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 2);
                    auVar82._4_4_ = uVar33;
                    auVar82._0_4_ = uVar33;
                    auVar82._8_4_ = uVar33;
                    auVar82._12_4_ = uVar33;
                    auVar82._16_4_ = uVar33;
                    auVar82._20_4_ = uVar33;
                    auVar82._24_4_ = uVar33;
                    auVar82._28_4_ = uVar33;
                    uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 4);
                    auVar85._4_4_ = uVar33;
                    auVar85._0_4_ = uVar33;
                    auVar85._8_4_ = uVar33;
                    auVar85._12_4_ = uVar33;
                    auVar85._16_4_ = uVar33;
                    auVar85._20_4_ = uVar33;
                    auVar85._24_4_ = uVar33;
                    auVar85._28_4_ = uVar33;
                    uVar33 = *(undefined4 *)(av1_warped_filter[iVar45] + 6);
                    auVar88._4_4_ = uVar33;
                    auVar88._0_4_ = uVar33;
                    auVar88._8_4_ = uVar33;
                    auVar88._12_4_ = uVar33;
                    auVar88._16_4_ = uVar33;
                    auVar88._20_4_ = uVar33;
                    auVar88._24_4_ = uVar33;
                    auVar88._28_4_ = uVar33;
                    auVar62 = vpalignr_avx2(auVar70,*(undefined1 (*) [32])(ref + lVar50 + -7),2);
                    auVar7 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar50 + -7),auVar62,0x20)
                    ;
                    auVar90 = vpblendd_avx2(auVar70,auVar62,0xf0);
                    auVar62 = vpalignr_avx2(auVar90,auVar7,4);
                    auVar81 = vpmaddwd_avx2(auVar62,auVar82);
                    auVar62 = vpalignr_avx2(auVar90,auVar7,8);
                    auVar69 = vpmaddwd_avx2(auVar85,auVar62);
                    auVar70 = vpmaddwd_avx2(auVar78,auVar7);
                    auVar62 = vpalignr_avx2(auVar90,auVar7,0xc);
                    auVar62 = vpmaddwd_avx2(auVar88,auVar62);
                    auVar62 = vpaddd_avx2(auVar69,auVar62);
                    auVar7._4_4_ = iVar47;
                    auVar7._0_4_ = iVar47;
                    auVar7._8_4_ = iVar47;
                    auVar7._12_4_ = iVar47;
                    auVar7._16_4_ = iVar47;
                    auVar7._20_4_ = iVar47;
                    auVar7._24_4_ = iVar47;
                    auVar7._28_4_ = iVar47;
                    auVar69 = vpaddd_avx2(auVar70,auVar7);
                    auVar69 = vpaddd_avx2(auVar69,auVar81);
                    auVar62 = vpaddd_avx2(auVar69,auVar62);
                    auVar62 = vpsrad_avx2(auVar62,auVar60);
                    *pauVar42 = auVar62;
                    lVar41 = lVar41 + 1;
                    iVar54 = iVar54 + iVar44;
                    pauVar42 = pauVar42 + 1;
                    lVar28 = lVar28 + 1;
                  } while (lVar41 < lVar56);
                }
              }
              else if (beta == 0) {
                if (-7 < iVar31) {
                  auVar89._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar54 + iVar57 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar45];
                  auVar89._16_16_ =
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 + iVar57 >> 10];
                  auVar64._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 * 3 + iVar54 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 * 2 + iVar54 >> 10];
                  auVar64._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 * 3 + iVar54 >> 10];
                  auVar71._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 * 5 + iVar54 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 * 4 + iVar54 >> 10];
                  auVar71._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 * 5 + iVar54 >> 10];
                  auVar83._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar54 + iVar57 * 7 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 * 6 + iVar54 >> 10];
                  auVar83._16_16_ =
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 + iVar57 * 7 >> 10];
                  auVar62 = vpunpckhdq_avx2(auVar89,auVar64);
                  auVar69 = vpunpckhdq_avx2(auVar71,auVar83);
                  auVar81 = vpunpckhqdq_avx2(auVar62,auVar69);
                  auVar90 = vpunpcklqdq_avx2(auVar62,auVar69);
                  auVar69 = vpunpckldq_avx2(auVar89,auVar64);
                  auVar70 = vpunpckldq_avx2(auVar71,auVar83);
                  auVar62 = vpunpckhqdq_avx2(auVar69,auVar70);
                  auVar69 = vpunpcklqdq_avx2(auVar69,auVar70);
                  lVar28 = (long)sVar37 + -7;
                  lVar41 = -7;
                  pauVar42 = (undefined1 (*) [32])local_240;
                  do {
                    iVar54 = iVar49;
                    if (lVar28 < lVar26) {
                      iVar54 = (int)lVar28;
                    }
                    if (lVar28 < 0) {
                      iVar54 = 0;
                    }
                    lVar50 = (long)(iVar54 * stride + iVar32);
                    auVar86._16_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    auVar86._0_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                    auVar70 = vpalignr_avx2(auVar86,*(undefined1 (*) [32])(ref + lVar50 + -7),2);
                    auVar85 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar50 + -7),auVar70,0x20
                                             );
                    auVar82 = vpblendd_avx2(auVar86,auVar70,0xf0);
                    auVar7 = vpmaddwd_avx2(auVar69,auVar85);
                    auVar70 = vpalignr_avx2(auVar82,auVar85,4);
                    auVar8 = vpmaddwd_avx2(auVar70,auVar62);
                    auVar70 = vpalignr_avx2(auVar82,auVar85,8);
                    auVar78 = vpmaddwd_avx2(auVar70,auVar90);
                    auVar70 = vpalignr_avx2(auVar82,auVar85,0xc);
                    auVar70 = vpmaddwd_avx2(auVar70,auVar81);
                    auVar70 = vpaddd_avx2(auVar78,auVar70);
                    auVar14._4_4_ = iVar47;
                    auVar14._0_4_ = iVar47;
                    auVar14._8_4_ = iVar47;
                    auVar14._12_4_ = iVar47;
                    auVar14._16_4_ = iVar47;
                    auVar14._20_4_ = iVar47;
                    auVar14._24_4_ = iVar47;
                    auVar14._28_4_ = iVar47;
                    auVar7 = vpaddd_avx2(auVar7,auVar14);
                    auVar7 = vpaddd_avx2(auVar7,auVar8);
                    auVar70 = vpaddd_avx2(auVar7,auVar70);
                    auVar70 = vpsrad_avx2(auVar70,auVar60);
                    *pauVar42 = auVar70;
                    lVar41 = lVar41 + 1;
                    pauVar42 = pauVar42 + 1;
                    lVar28 = lVar28 + 1;
                  } while (lVar41 < lVar56);
                }
              }
              else if (-7 < iVar31) {
                iVar54 = uVar53 + iVar35;
                lVar28 = (long)sVar37 + -7;
                lVar41 = -7;
                pauVar42 = (undefined1 (*) [32])local_240;
                do {
                  iVar45 = iVar49;
                  if (lVar28 < lVar26) {
                    iVar45 = (int)lVar28;
                  }
                  if (lVar28 < 0) {
                    iVar45 = 0;
                  }
                  auVar77._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 + iVar54 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar54 >> 10];
                  auVar77._16_16_ =
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 + iVar54 >> 10];
                  iVar24 = iVar57 * 2 + iVar54;
                  iVar23 = iVar57 + iVar24;
                  iVar46 = iVar57 + iVar23;
                  auVar63._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar23 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                  auVar63._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar23 >> 10];
                  iVar23 = iVar57 + iVar46;
                  iVar24 = iVar57 + iVar23;
                  auVar68._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar23 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar46 >> 10];
                  auVar68._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar23 >> 10];
                  auVar80._0_16_ =
                       ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar57 + iVar24 >> 10] +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
                  auVar80._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar57 + iVar24 >> 10];
                  lVar50 = (long)(iVar45 * stride + iVar32);
                  auVar87._16_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                  auVar87._0_16_ = *(undefined1 (*) [16])(ref + lVar50 + 1);
                  auVar81 = vpunpckldq_avx2(auVar77,auVar63);
                  auVar62 = vpunpckhdq_avx2(auVar77,auVar63);
                  auVar70 = vpunpckldq_avx2(auVar68,auVar80);
                  auVar69 = vpunpckhdq_avx2(auVar68,auVar80);
                  auVar7 = vpunpcklqdq_avx2(auVar81,auVar70);
                  auVar70 = vpunpckhqdq_avx2(auVar81,auVar70);
                  auVar8 = vpunpcklqdq_avx2(auVar62,auVar69);
                  auVar90 = vpunpckhqdq_avx2(auVar62,auVar69);
                  auVar62 = vpalignr_avx2(auVar87,*(undefined1 (*) [32])(ref + lVar50 + -7),2);
                  auVar82 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar50 + -7),auVar62,0x20);
                  auVar78 = vpblendd_avx2(auVar87,auVar62,0xf0);
                  auVar81 = vpmaddwd_avx2(auVar82,auVar7);
                  auVar62 = vpalignr_avx2(auVar78,auVar82,4);
                  auVar69 = vpmaddwd_avx2(auVar62,auVar70);
                  auVar62 = vpalignr_avx2(auVar78,auVar82,8);
                  auVar62 = vpmaddwd_avx2(auVar8,auVar62);
                  auVar62 = vpaddd_avx2(auVar62,auVar69);
                  auVar69 = vpalignr_avx2(auVar78,auVar82,0xc);
                  auVar70 = vpmaddwd_avx2(auVar90,auVar69);
                  auVar13._4_4_ = iVar47;
                  auVar13._0_4_ = iVar47;
                  auVar13._8_4_ = iVar47;
                  auVar13._12_4_ = iVar47;
                  auVar13._16_4_ = iVar47;
                  auVar13._20_4_ = iVar47;
                  auVar13._24_4_ = iVar47;
                  auVar13._28_4_ = iVar47;
                  auVar69 = vpaddd_avx2(auVar81,auVar13);
                  auVar62 = vpaddd_avx2(auVar69,auVar62);
                  auVar62 = vpaddd_avx2(auVar62,auVar70);
                  auVar62 = vpsrad_avx2(auVar62,auVar60);
                  *pauVar42 = auVar62;
                  lVar41 = lVar41 + 1;
                  pauVar42 = pauVar42 + 1;
                  iVar54 = iVar54 + iVar44;
                  lVar28 = lVar28 + 1;
                } while (lVar41 < lVar56);
              }
            }
          }
          else if (-7 < iVar31) {
            lVar28 = (long)sVar37 + -7;
            lVar41 = -7;
            pauVar42 = (undefined1 (*) [32])local_240;
            do {
              iVar32 = iVar49;
              if (lVar28 < lVar26) {
                iVar32 = (int)lVar28;
              }
              if (lVar28 < 0) {
                iVar32 = 0;
              }
              auVar60._0_2_ =
                   (undefined2)
                   (((uint)ref[iVar32 * stride + iVar36] << (7 - bVar10 & 0x1f)) + iVar48);
              auVar60._2_2_ = auVar60._0_2_;
              auVar60._4_2_ = auVar60._0_2_;
              auVar60._6_2_ = auVar60._0_2_;
              auVar60._8_2_ = auVar60._0_2_;
              auVar60._10_2_ = auVar60._0_2_;
              auVar60._12_2_ = auVar60._0_2_;
              auVar60._14_2_ = auVar60._0_2_;
              auVar62 = vpmovsxwd_avx2(auVar60);
              *pauVar42 = auVar62;
              lVar41 = lVar41 + 1;
              pauVar42 = pauVar42 + 1;
              lVar28 = lVar28 + 1;
            } while (lVar41 < lVar56);
          }
          if (0 < iVar31) {
            iVar45 = (((uint)lVar40 & 0xfffc) + (delta + iVar30) * -4 & 0xffffffc0) + 0x10200;
            lVar28 = -4;
            pauVar42 = (undefined1 (*) [32])local_160;
            iVar32 = local_488;
            iVar54 = iVar38;
            do {
              auVar67._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 + iVar45 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar45 >> 10];
              auVar67._16_16_ =
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 + iVar45 >> 10];
              iVar23 = iVar30 * 2 + iVar45;
              iVar46 = iVar30 + iVar23;
              iVar24 = iVar30 + iVar46;
              auVar61._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar46 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar23 >> 10];
              auVar61._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar46 >> 10];
              iVar46 = iVar30 + iVar24;
              iVar23 = iVar30 + iVar46;
              auVar76._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar46 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar24 >> 10];
              auVar76._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar46 >> 10];
              auVar79._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 + iVar23 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar23 >> 10];
              auVar79._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 + iVar23 >> 10];
              auVar81 = vpunpckldq_avx2(auVar67,auVar61);
              auVar62 = vpunpckhdq_avx2(auVar67,auVar61);
              auVar70 = vpunpckldq_avx2(auVar76,auVar79);
              auVar69 = vpunpckhdq_avx2(auVar76,auVar79);
              auVar90 = vpunpcklqdq_avx2(auVar81,auVar70);
              auVar81 = vpunpckhqdq_avx2(auVar81,auVar70);
              auVar7 = vpunpcklqdq_avx2(auVar62,auVar69);
              auVar70 = vpunpckhqdq_avx2(auVar62,auVar69);
              auVar69 = vpunpckldq_avx2(pauVar42[-7],pauVar42[-6]);
              auVar62 = vpunpckhdq_avx2(pauVar42[-7],pauVar42[-6]);
              auVar62 = vpackusdw_avx2(auVar69,auVar62);
              auVar69 = vpmaddwd_avx2(auVar62,auVar90);
              auVar90 = vpunpckldq_avx2(pauVar42[-5],pauVar42[-4]);
              auVar62 = vpunpckhdq_avx2(pauVar42[-5],pauVar42[-4]);
              auVar62 = vpackusdw_avx2(auVar90,auVar62);
              auVar62 = vpmaddwd_avx2(auVar62,auVar81);
              auVar69 = vpaddd_avx2(auVar62,auVar69);
              auVar81 = vpunpckldq_avx2(pauVar42[-3],pauVar42[-2]);
              auVar62 = vpunpckhdq_avx2(pauVar42[-3],pauVar42[-2]);
              auVar62 = vpackusdw_avx2(auVar81,auVar62);
              auVar81 = vpmaddwd_avx2(auVar7,auVar62);
              auVar90 = vpunpckldq_avx2(pauVar42[-1],*pauVar42);
              auVar62 = vpunpckhdq_avx2(pauVar42[-1],*pauVar42);
              auVar62 = vpackusdw_avx2(auVar90,auVar62);
              auVar62 = vpmaddwd_avx2(auVar62,auVar70);
              auVar62 = vpaddd_avx2(auVar81,auVar62);
              auVar62 = vpaddd_avx2(auVar69,auVar62);
              auVar69 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
              auVar62 = vpermd_avx2(auVar69,auVar62);
              if (conv_params->is_compound == 0) {
                auVar18._4_4_ = iVar43;
                auVar18._0_4_ = iVar43;
                auVar18._8_4_ = iVar43;
                auVar18._12_4_ = iVar43;
                auVar18._16_4_ = iVar43;
                auVar18._20_4_ = iVar43;
                auVar18._24_4_ = iVar43;
                auVar18._28_4_ = iVar43;
                auVar62 = vpaddd_avx2(auVar62,auVar18);
                auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar51));
                auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                auVar17._8_2_ = uVar84;
                auVar17._0_8_ =
                     CONCAT26(uVar12,CONCAT24(uVar12,CONCAT22(uVar12,uVar12))) ^ 0xffffffffffffffff;
                auVar17._10_2_ = uVar84;
                auVar17._12_2_ = uVar84;
                auVar17._14_2_ = uVar84;
                auVar60 = vpminsw_avx(auVar60,auVar17);
                auVar60 = vpmaxsw_avx(auVar60,_DAT_004d7f80);
                *(undefined1 (*) [16])(pred + iVar32) = auVar60;
              }
              else {
                iVar23 = conv_params->dst_stride * iVar54 + iVar25;
                auVar62 = vpaddd_avx2(auVar62,auVar65);
                auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar51));
                if (conv_params->do_average == 0) {
                  auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                  *(undefined1 (*) [16])(conv_params->dst + iVar23) = auVar60;
                }
                else {
                  auVar69 = vpmovzxwd_avx2(*(undefined1 (*) [16])(conv_params->dst + iVar23));
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    auVar62 = vpaddd_avx2(auVar62,auVar69);
                    auVar62 = vpsrad_avx2(auVar62,1);
                  }
                  else {
                    auVar16._4_4_ = iVar1;
                    auVar16._0_4_ = iVar1;
                    auVar16._8_4_ = iVar1;
                    auVar16._12_4_ = iVar1;
                    auVar16._16_4_ = iVar1;
                    auVar16._20_4_ = iVar1;
                    auVar16._24_4_ = iVar1;
                    auVar16._28_4_ = iVar1;
                    auVar69 = vpmulld_avx2(auVar69,auVar16);
                    auVar15._4_4_ = iVar2;
                    auVar15._0_4_ = iVar2;
                    auVar15._8_4_ = iVar2;
                    auVar15._12_4_ = iVar2;
                    auVar15._16_4_ = iVar2;
                    auVar15._20_4_ = iVar2;
                    auVar15._24_4_ = iVar2;
                    auVar15._28_4_ = iVar2;
                    auVar62 = vpmulld_avx2(auVar62,auVar15);
                    auVar62 = vpaddd_avx2(auVar69,auVar62);
                    auVar62 = vpsrad_avx2(auVar62,4);
                  }
                  auVar19._4_4_ = iVar39;
                  auVar19._0_4_ = iVar39;
                  auVar19._8_4_ = iVar39;
                  auVar19._12_4_ = iVar39;
                  auVar19._16_4_ = iVar39;
                  auVar19._20_4_ = iVar39;
                  auVar19._24_4_ = iVar39;
                  auVar19._28_4_ = iVar39;
                  auVar62 = vpaddd_avx2(auVar62,auVar19);
                  auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar55));
                  auVar60 = vpackusdw_avx(auVar62._0_16_,auVar62._16_16_);
                  auVar20._2_2_ = uVar21;
                  auVar20._0_2_ = uVar21;
                  auVar20._4_2_ = uVar21;
                  auVar20._6_2_ = uVar21;
                  auVar20._8_2_ = uVar21;
                  auVar20._10_2_ = uVar21;
                  auVar20._12_2_ = uVar21;
                  auVar20._14_2_ = uVar21;
                  auVar60 = vpminsw_avx(auVar60,auVar20);
                  *(undefined1 (*) [16])(pred + iVar32) = auVar60;
                }
              }
              lVar28 = lVar28 + 1;
              pauVar42 = pauVar42 + 1;
              iVar45 = iVar45 + delta;
              iVar32 = iVar32 + p_stride;
              iVar54 = iVar54 + 1;
            } while (lVar28 < iVar22 + -4);
          }
          iVar25 = iVar25 + 8;
          local_488 = local_488 + 8;
        } while (iVar25 < p_width);
      }
      iVar38 = iVar38 + 8;
      local_4a4 = local_4a4 + p_stride * 8;
    } while (iVar38 < p_height);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_avx2(const int32_t *mat, const uint16_t *ref,
                                 int width, int height, int stride,
                                 uint16_t *pred, int p_col, int p_row,
                                 int p_width, int p_height, int p_stride,
                                 int subsampling_x, int subsampling_y, int bd,
                                 ConvolveParams *conv_params, int16_t alpha,
                                 int16_t beta, int16_t gamma, int16_t delta) {
  __m256i tmp[15];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const __m256i res_sub_const =
      _mm256_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                        (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m256i round_bits_const = _mm256_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);

  __m256i v_rbhoriz = _mm256_set1_epi32(1 << (reduce_bits_horiz - 1));
  __m256i v_zeros = _mm256_setzero_si256();
  int ohoriz = 1 << offset_bits_horiz;
  int mhoriz = 1 << max_bits_horiz;
  (void)mhoriz;
  int sx;

  for (int i = 0; i < p_height; i += 8) {
    for (int j = 0; j < p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int16_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int16_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      if (ix4 <= -7) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(_mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (ix4 >= width + 6) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        int32_t tmp1[8];
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          const int iy = clamp(iy4 + k, 0, height - 1);

          sx = sx4 + beta * (k + 4);
          for (int l = -4; l < 4; ++l) {
            int ix = ix4 + l - 3;
            const int offs = sx >> WARPEDDIFF_PREC_BITS;
            const int16_t *coeffs = av1_warped_filter[offs];

            int32_t sum = 1 << offset_bits_horiz;
            for (int m = 0; m < 8; ++m) {
              const int sample_x = clamp(ix + m, 0, width - 1);
              sum += ref[iy * stride + sample_x] * coeffs[m];
            }
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
            tmp1[(l + 4) / 2 + ((l + 4) % 2) * 4] = sum;
            sx += alpha;
          }
          tmp[k + 7] = _mm256_loadu_si256((__m256i *)tmp1);
        }
      } else {
        if (beta == 0 && alpha == 0) {
          sx = sx4;
          __m128i v_01 = _mm_loadu_si128(
              (__m128i *)
                  av1_warped_filter[sx >>
                                    WARPEDDIFF_PREC_BITS]);  // A7A6A5A4A3A2A1A0
          __m256i v_c01 = _mm256_broadcastd_epi32(v_01);     // A1A0A1A0A1A0A1A0
          __m256i v_c23 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
          __m256i v_c45 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
          __m256i v_c67 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (alpha == 0) {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m128i v_01 = _mm_loadu_si128(
                (__m128i *)av1_warped_filter
                    [sx >> WARPEDDIFF_PREC_BITS]);          // A7A6A5A4A3A2A1A0
            __m256i v_c01 = _mm256_broadcastd_epi32(v_01);  // A1A0A1A0A1A0A1A0
            __m256i v_c23 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
            __m256i v_c45 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
            __m256i v_c67 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (beta == 0) {
          sx = sx4;
          __m256i v_coeff01 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff01 = _mm256_inserti128_si256(
              v_coeff01,
              _mm_loadu_si128(
                  (__m128i *)
                      av1_warped_filter[(sx + alpha) >> WARPEDDIFF_PREC_BITS]),
              1);  // B7B6..B1B0A7A6..A1A0
          __m256i v_coeff23 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff23 = _mm256_inserti128_si256(
              v_coeff23,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // D7D6..D1D0C7C6..C1C0
          __m256i v_coeff45 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff45 = _mm256_inserti128_si256(
              v_coeff45,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // F7F6..F1F0E7E6..E1E0
          __m256i v_coeff67 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff67 = _mm256_inserti128_si256(
              v_coeff67,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // H7H6..H1H0G7G6..G1G0

          __m256i v_c0123 = _mm256_unpacklo_epi32(
              v_coeff01,
              v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
          __m256i v_c0123u = _mm256_unpackhi_epi32(
              v_coeff01,
              v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
          __m256i v_c4567 = _mm256_unpacklo_epi32(
              v_coeff45,
              v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
          __m256i v_c4567u = _mm256_unpackhi_epi32(
              v_coeff45,
              v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

          __m256i v_c01 = _mm256_unpacklo_epi64(
              v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
          __m256i v_c23 =
              _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
          __m256i v_c45 =
              _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
          __m256i v_c67 =
              _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }

        } else {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m256i v_coeff01 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff01 = _mm256_inserti128_si256(
                v_coeff01,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // B7B6..B1B0A7A6..A1A0
            __m256i v_coeff23 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff23 = _mm256_inserti128_si256(
                v_coeff23,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // D7D6..D1D0C7C6..C1C0
            __m256i v_coeff45 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff45 = _mm256_inserti128_si256(
                v_coeff45,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // F7F6..F1F0E7E6..E1E0
            __m256i v_coeff67 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff67 = _mm256_inserti128_si256(
                v_coeff67,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // H7H6..H1H0G7G6..G1G0

            __m256i v_c0123 = _mm256_unpacklo_epi32(
                v_coeff01,
                v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
            __m256i v_c0123u = _mm256_unpackhi_epi32(
                v_coeff01,
                v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
            __m256i v_c4567 = _mm256_unpacklo_epi32(
                v_coeff45,
                v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
            __m256i v_c4567u = _mm256_unpackhi_epi32(
                v_coeff45,
                v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

            __m256i v_c01 = _mm256_unpacklo_epi64(
                v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
            __m256i v_c23 =
                _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
            __m256i v_c45 =
                _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
            __m256i v_c67 =
                _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        const __m256i *src = tmp + (k + 4);

        __m256i v_coeff01 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128(
                (__m128i *)av1_warped_filter[(sy) >> WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff01 = _mm256_inserti128_si256(
            v_coeff01,
            _mm_loadu_si128(
                (__m128i *)
                    av1_warped_filter[(sy + gamma) >> WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff23 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 2 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff23 = _mm256_inserti128_si256(
            v_coeff23,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 3 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff45 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 4 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff45 = _mm256_inserti128_si256(
            v_coeff45,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 5 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff67 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 6 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff67 = _mm256_inserti128_si256(
            v_coeff67,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 7 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);

        __m256i v_c0123 = _mm256_unpacklo_epi32(
            v_coeff01,
            v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
        __m256i v_c0123u = _mm256_unpackhi_epi32(
            v_coeff01,
            v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
        __m256i v_c4567 = _mm256_unpacklo_epi32(
            v_coeff45,
            v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
        __m256i v_c4567u = _mm256_unpackhi_epi32(
            v_coeff45,
            v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

        __m256i v_c01 = _mm256_unpacklo_epi64(
            v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
        __m256i v_c23 =
            _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
        __m256i v_c45 =
            _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
        __m256i v_c67 =
            _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

        __m256i v_src01l =
            _mm256_unpacklo_epi32(src[0], src[1]);  // T13T03T11T01T12T02T10T00
        __m256i v_src01u =
            _mm256_unpackhi_epi32(src[0], src[1]);  // T17T07T15T05T16T06T14T04
        __m256i v_sum =
            _mm256_madd_epi16(_mm256_packus_epi32(v_src01l, v_src01u),
                              v_c01);  // S7S5S3S1S6S4S2S0

        __m256i v_src23l = _mm256_unpacklo_epi32(src[2], src[3]);
        __m256i v_src23u = _mm256_unpackhi_epi32(src[2], src[3]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src23l, v_src23u), v_c23));

        __m256i v_src45l = _mm256_unpacklo_epi32(src[4], src[5]);
        __m256i v_src45u = _mm256_unpackhi_epi32(src[4], src[5]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src45l, v_src45u), v_c45));

        __m256i v_src67l = _mm256_unpacklo_epi32(src[6], src[7]);
        __m256i v_src67u = _mm256_unpackhi_epi32(src[6], src[7]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src67l, v_src67u), v_c67));

        // unpack S7S5S3S1S6S4S2S0 to S7S6S5S4S3S2S1S0

        __m256i v_suml =
            _mm256_permute4x64_epi64(v_sum, 0xD8);  // S7S5S6S4S3S1S2S0
        __m256i v_sumh =
            _mm256_permute4x64_epi64(v_sum, 0x32);      // S2S0S7S5S2S0S3S1
        v_sum = _mm256_unpacklo_epi32(v_suml, v_sumh);  // S7S6S5S4S3S2S1S0

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];

          v_sum = _mm256_add_epi32(v_sum, res_add_const);
          v_sum =
              _mm256_sra_epi32(_mm256_add_epi32(v_sum, reduce_bits_vert_const),
                               reduce_bits_vert_shift);
          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m256i p_32 = _mm256_cvtepu16_epi32(_mm_loadu_si128(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              v_sum = _mm256_add_epi32(_mm256_mullo_epi32(p_32, wt0),
                                       _mm256_mullo_epi32(v_sum, wt1));
              v_sum = _mm256_srai_epi32(v_sum, DIST_PRECISION_BITS);
            } else {
              v_sum = _mm256_srai_epi32(_mm256_add_epi32(p_32, v_sum), 1);
            }

            __m256i v_sum1 = _mm256_add_epi32(v_sum, res_sub_const);
            v_sum1 = _mm256_sra_epi32(
                _mm256_add_epi32(v_sum1, round_bits_const), round_bits_shift);

            __m256i v_sum16 = _mm256_packus_epi32(v_sum1, v_sum1);
            v_sum16 = _mm256_permute4x64_epi64(v_sum16, 0xD8);
            v_sum16 = _mm256_min_epi16(v_sum16, clip_pixel);
            _mm_storeu_si128(dst16, _mm256_extracti128_si256(v_sum16, 0));
          } else {
            v_sum = _mm256_packus_epi32(v_sum, v_sum);
            __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum, 0xD8);
            _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
          }
        } else {
          // Round and pack into 8 bits
          const __m256i round_const =
              _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                ((1 << reduce_bits_vert) >> 1));

          __m256i v_sum1 = _mm256_srai_epi32(
              _mm256_add_epi32(v_sum, round_const), reduce_bits_vert);

          v_sum1 = _mm256_packus_epi32(v_sum1, v_sum1);
          __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum1, 0xD8);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m256i max_val = _mm256_set1_epi16((1 << bd) - 1);
          const __m256i zero = _mm256_setzero_si256();
          v_sum16 = _mm256_max_epi16(_mm256_min_epi16(v_sum16, max_val), zero);

          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
        }
      }
    }
  }
}